

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void GetFiles(string *pattern,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *files)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  glob_t g;
  allocator<char> local_a1;
  LogMessage local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  glob_t local_70;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(files);
  iVar1 = glob((pattern->_M_dataplus)._M_p,0,(__errfunc *)0x0,&local_70);
  if ((iVar1 != 0) && (iVar1 != 3)) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x272);
    poVar2 = google::LogMessage::stream(&local_a0);
    poVar2 = std::operator<<(poVar2,"Check failed: (r == 0) || (r == GLOB_NOMATCH) ");
    poVar2 = std::operator<<(poVar2,": error matching ");
    std::operator<<(poVar2,(string *)pattern);
    if (iVar1 != 3) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a0);
    }
  }
  for (uVar3 = 0; uVar3 < local_70.gl_pathc; uVar3 = uVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,local_70.gl_pathv[uVar3],&local_a1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_90)
    ;
    std::__cxx11::string::~string((string *)&local_90);
  }
  globfree(&local_70);
  return;
}

Assistant:

static void GetFiles(const string& pattern, vector<string>* files) {
  files->clear();
#if defined(HAVE_GLOB_H)
  glob_t g;
  const int r = glob(pattern.c_str(), 0, NULL, &g);
  CHECK((r == 0) || (r == GLOB_NOMATCH)) << ": error matching " << pattern;
  for (size_t i = 0; i < g.gl_pathc; i++) {
    files->push_back(string(g.gl_pathv[i]));
  }
  globfree(&g);
#elif defined(OS_WINDOWS)
  WIN32_FIND_DATAA data;
  HANDLE handle = FindFirstFileA(pattern.c_str(), &data);
  size_t index = pattern.rfind('\\');
  if (index == string::npos) {
    LOG(FATAL) << "No directory separator.";
  }
  const string dirname = pattern.substr(0, index + 1);
  if (handle == INVALID_HANDLE_VALUE) {
    // Finding no files is OK.
    return;
  }
  do {
    files->push_back(dirname + data.cFileName);
  } while (FindNextFileA(handle, &data));
  BOOL result = FindClose(handle);
  LOG_SYSRESULT(result);
#else
# error There is no way to do glob.
#endif
}